

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzz_issue_tests.cpp
# Opt level: O2

void __thiscall rtripProblems::~rtripProblems(rtripProblems *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

TEST_P(rtripProblems, rtripFiles)
{
    auto cdata = loadFailureFile("rtrip_fail", GetParam());
    auto u1 = unit_from_string(cdata);
    if (!is_error(u1)) {
        auto str = to_string(u1);
        auto u2 = unit_from_string(str);
        EXPECT_FALSE(is_error(u2));
        if (u2 == u1) {
            EXPECT_EQ(u2, u1);
            EXPECT_EQ(unit_cast(u2), unit_cast(u1));
            EXPECT_FALSE(units::unit_cast(u2) != units::unit_cast(u1));
        } else if (!is_error(root(u2, 2))) {
            EXPECT_EQ(root(unit_cast(u2), 2), root(unit_cast(u1), 2));
            EXPECT_FALSE(
                root(units::unit_cast(u2), 2) != root(units::unit_cast(u1), 2));
        } else if (!is_error(root(u2, 3))) {
            EXPECT_EQ(root(unit_cast(u2), 3), root(unit_cast(u1), 3));
            EXPECT_FALSE(
                root(units::unit_cast(u2), 3) != root(units::unit_cast(u1), 3));
        } else {
            EXPECT_TRUE(unit_cast(u2) == unit_cast(u1));
            EXPECT_FALSE(units::unit_cast(u2) != units::unit_cast(u1));
        }
    }
}